

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_memory_manager.cpp
# Opt level: O2

void __thiscall duckdb::TemporaryMemoryManager::Verify(TemporaryMemoryManager *this)

{
  return;
}

Assistant:

void TemporaryMemoryManager::Verify() const {
#ifdef DEBUG
	idx_t total_reservation = 0;
	idx_t total_remaining_size = 0;
	for (auto &active_state : active_states) {
		total_reservation += active_state.get().GetReservation();
		total_remaining_size += active_state.get().GetRemainingSize();
	}
	D_ASSERT(total_reservation == this->reservation);
	D_ASSERT(total_remaining_size == this->remaining_size);
#endif
}